

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

_func_DescriptorDatabaseTestCase_ptr ** __thiscall
testing::internal::
ValuesInIteratorRangeGenerator<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*)()>
::Iterator::Current(Iterator *this)

{
  pointer __old_p;
  _func_DescriptorDatabaseTestCase_ptr **pp_Var1;
  
  __old_p = (this->value_)._M_t.
            super___uniq_ptr_impl<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*const)(),_std::default_delete<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*const)()>_>
            ._M_t.
            super__Tuple_impl<0UL,_google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*const_*)(),_std::default_delete<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*const)()>_>
            .
            super__Head_base<0UL,_google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*const_*)(),_false>
            ._M_head_impl;
  if (__old_p != (pointer)0x0) {
    return __old_p;
  }
  pp_Var1 = (_func_DescriptorDatabaseTestCase_ptr **)operator_new(8);
  *pp_Var1 = *(this->iterator_)._M_current;
  (this->value_)._M_t.
  super___uniq_ptr_impl<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*const)(),_std::default_delete<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*const)()>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*const_*)(),_std::default_delete<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*const)()>_>
  .
  super__Head_base<0UL,_google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*const_*)(),_false>
  ._M_head_impl = pp_Var1;
  return pp_Var1;
}

Assistant:

const T* Current() const override {
      if (value_.get() == nullptr) value_.reset(new T(*iterator_));
      return value_.get();
    }